

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::refreshBroadphaseProxy
          (cbtCollisionWorld *this,cbtCollisionObject *collisionObject)

{
  uint uVar1;
  uint uVar2;
  cbtBroadphaseProxy *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  cbtVector3 maxAabb;
  cbtVector3 minAabb;
  cbtTransform trans;
  
  pcVar3 = collisionObject->m_broadphaseHandle;
  if (pcVar3 != (cbtBroadphaseProxy *)0x0) {
    uVar1 = pcVar3->m_collisionFilterGroup;
    uVar2 = pcVar3->m_collisionFilterMask;
    (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[3])
              (this->m_broadphasePairCache,pcVar3,this->m_dispatcher1);
    trans.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[0].m_floats;
    trans.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[0].m_floats + 2);
    trans.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[1].m_floats;
    trans.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[1].m_floats + 2);
    trans.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[2].m_floats;
    trans.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[2].m_floats + 2);
    trans.m_origin.m_floats._0_8_ =
         *(undefined8 *)(collisionObject->m_worldTransform).m_origin.m_floats;
    trans.m_origin.m_floats._8_8_ =
         *(undefined8 *)((collisionObject->m_worldTransform).m_origin.m_floats + 2);
    (*collisionObject->m_collisionShape->_vptr_cbtCollisionShape[2])
              (collisionObject->m_collisionShape,&trans,&minAabb,&maxAabb);
    iVar4 = (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[2])
                      (this->m_broadphasePairCache,&minAabb,&maxAabb,
                       (ulong)(uint)collisionObject->m_collisionShape->m_shapeType,collisionObject,
                       (ulong)uVar1,(ulong)uVar2,this->m_dispatcher1);
    collisionObject->m_broadphaseHandle = (cbtBroadphaseProxy *)CONCAT44(extraout_var,iVar4);
  }
  return;
}

Assistant:

void cbtCollisionWorld::refreshBroadphaseProxy(cbtCollisionObject* collisionObject)
{
	if (collisionObject->getBroadphaseHandle())
	{
		int collisionFilterGroup = collisionObject->getBroadphaseHandle()->m_collisionFilterGroup;
		int collisionFilterMask = collisionObject->getBroadphaseHandle()->m_collisionFilterMask;

		getBroadphase()->destroyProxy(collisionObject->getBroadphaseHandle(), getDispatcher());

		//calculate new AABB
		cbtTransform trans = collisionObject->getWorldTransform();

		cbtVector3 minAabb;
		cbtVector3 maxAabb;
		collisionObject->getCollisionShape()->getAabb(trans, minAabb, maxAabb);

		int type = collisionObject->getCollisionShape()->getShapeType();
		collisionObject->setBroadphaseHandle(getBroadphase()->createProxy(
			minAabb,
			maxAabb,
			type,
			collisionObject,
			collisionFilterGroup,
			collisionFilterMask,
			m_dispatcher1));
	}
}